

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trust_token_test.cc
# Opt level: O1

void __thiscall
bssl::anon_unknown_0::TrustTokenMetadataTest_ExcessDataProof_Test::TestBody
          (TrustTokenMetadataTest_ExcessDataProof_Test *this)

{
  uint32_t public_metadata;
  TRUST_TOKEN_ISSUER *ctx;
  TRUST_TOKEN_METHOD *pTVar1;
  TRUST_TOKEN_METHOD *pTVar2;
  AssertionResult *pAVar3;
  uint8_t *request;
  bool bVar4;
  int iVar5;
  ParamType *pPVar6;
  TRUST_TOKEN_METHOD *pTVar7;
  TRUST_TOKEN_METHOD *pTVar8;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  __ptr_00;
  char *in_R9;
  char *pcVar9;
  size_t len;
  pointer *__ptr;
  ulong uVar10;
  AssertionResult gtest_ar__11;
  AssertionResult gtest_ar__3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  uint8_t *bad_buf;
  CBS tmp;
  size_t bad_len;
  uint16_t count;
  CBB dleq;
  CBS real_response;
  UniquePtr<uint8_t> free_bad;
  ScopedCBB bad_response;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_90;
  size_t key_index;
  AssertHelper local_80;
  uint8_t *issue_msg;
  uint32_t parsed_public_metadata;
  UniquePtr<struct_stack_st_TRUST_TOKEN> tokens;
  UniquePtr<uint8_t> free_msg;
  UniquePtr<uint8_t> free_issue_msg;
  size_t msg_len;
  uint8_t *issue_resp;
  size_t resp_len;
  size_t tokens_issued;
  
  if ((((this->super_TrustTokenMetadataTest).super_TrustTokenProtocolTestBase.method_)->
       has_private_metadata == 0) &&
     (pPVar6 = testing::
               WithParamInterface<std::tuple<const_trust_token_method_st_*,_bool,_int,_bool>_>::
               GetParam(),
     (pPVar6->super__Tuple_impl<0UL,_const_trust_token_method_st_*,_bool,_int,_bool>).
     super__Tuple_impl<1UL,_bool,_int,_bool>.super__Tuple_impl<2UL,_int,_bool>.
     super__Tuple_impl<3UL,_bool>.super__Head_base<3UL,_bool,_false>._M_head_impl != false)) {
    return;
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (!bVar4) {
LAB_003a165c:
    testing::Message::Message((Message *)&bad_response);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&dleq,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
               ,0x45e,
               "Expected: SetupContexts() doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&dleq,(Message *)&bad_response);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&dleq);
    if (bad_response.ctx_.child != (CBB *)0x0) {
      (**(code **)&(bad_response.ctx_.child)->child->is_child)();
    }
    return;
  }
  testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
            ((HasNewFatalFailureHelper *)&bad_response);
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    TrustTokenProtocolTestBase::SetupContexts((TrustTokenProtocolTestBase *)this);
  }
  testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
            ((HasNewFatalFailureHelper *)&bad_response);
  if (bad_response.ctx_.is_child == '\x01') goto LAB_003a165c;
  issue_msg = (uint8_t *)0x0;
  issue_resp = (uint8_t *)0x0;
  if ((this->super_TrustTokenMetadataTest).super_TrustTokenProtocolTestBase.use_msg_ == true) {
    pcVar9 = &DAT_00000004;
    iVar5 = TRUST_TOKEN_CLIENT_begin_issuance_over_message
                      ((this->super_TrustTokenMetadataTest).super_TrustTokenProtocolTestBase.client.
                       _M_t.super___uniq_ptr_impl<trust_token_client_st,_bssl::internal::Deleter>.
                       _M_t.super__Tuple_impl<0UL,_trust_token_client_st_*,_bssl::internal::Deleter>
                       .super__Head_base<0UL,_trust_token_client_st_*,_false>._M_head_impl,
                       &issue_msg,&msg_len,10,"MSG",4);
    dleq.child._0_1_ = iVar5 != 0;
    dleq.is_child = '\0';
    dleq._9_7_ = 0;
    if (!(bool)dleq.child._0_1_) {
      testing::Message::Message((Message *)&gtest_ar__3);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&bad_response,(internal *)&dleq,
                 (AssertionResult *)
                 "TRUST_TOKEN_CLIENT_begin_issuance_over_message( client.get(), &issue_msg, &msg_len, 10, kMessage, sizeof(kMessage))"
                 ,"false","true",pcVar9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&real_response,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
                 ,0x464,(char *)bad_response.ctx_.child);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&real_response,(Message *)&gtest_ar__3);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&real_response);
      if (bad_response.ctx_.child != (CBB *)&bad_response.ctx_.u) {
        operator_delete(bad_response.ctx_.child,(ulong)(bad_response.ctx_.u.base.buf + 1));
      }
      if ((long *)CONCAT71(gtest_ar__3._1_7_,gtest_ar__3.success_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(gtest_ar__3._1_7_,gtest_ar__3.success_) + 8))();
      }
joined_r0x003a1b4a:
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)dleq._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        return;
      }
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&dleq.is_child,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)dleq._8_8_);
      return;
    }
  }
  else {
    iVar5 = TRUST_TOKEN_CLIENT_begin_issuance
                      ((this->super_TrustTokenMetadataTest).super_TrustTokenProtocolTestBase.client.
                       _M_t.super___uniq_ptr_impl<trust_token_client_st,_bssl::internal::Deleter>.
                       _M_t.super__Tuple_impl<0UL,_trust_token_client_st_*,_bssl::internal::Deleter>
                       .super__Head_base<0UL,_trust_token_client_st_*,_false>._M_head_impl,
                       &issue_msg,&msg_len,10);
    dleq.child._0_1_ = iVar5 != 0;
    dleq.is_child = '\0';
    dleq._9_7_ = 0;
    if (!(bool)dleq.child._0_1_) {
      testing::Message::Message((Message *)&gtest_ar__3);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&bad_response,(internal *)&dleq,
                 (AssertionResult *)
                 "TRUST_TOKEN_CLIENT_begin_issuance(client.get(), &issue_msg, &msg_len, 10)","false"
                 ,"true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&real_response,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
                 ,0x467,(char *)bad_response.ctx_.child);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&real_response,(Message *)&gtest_ar__3);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&real_response);
      if (bad_response.ctx_.child != (CBB *)&bad_response.ctx_.u) {
        operator_delete(bad_response.ctx_.child,(ulong)(bad_response.ctx_.u.base.buf + 1));
      }
      if ((long *)CONCAT71(gtest_ar__3._1_7_,gtest_ar__3.success_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(gtest_ar__3._1_7_,gtest_ar__3.success_) + 8))();
      }
      goto joined_r0x003a1b4a;
    }
  }
  request = issue_msg;
  dleq.is_child = '\0';
  dleq._9_7_ = 0;
  free_issue_msg._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)
       (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)issue_msg;
  ctx = (this->super_TrustTokenMetadataTest).super_TrustTokenProtocolTestBase.issuer._M_t.
        super___uniq_ptr_impl<trust_token_issuer_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_trust_token_issuer_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_trust_token_issuer_st_*,_false>._M_head_impl;
  pPVar6 = testing::WithParamInterface<std::tuple<const_trust_token_method_st_*,_bool,_int,_bool>_>
           ::GetParam();
  public_metadata =
       (pPVar6->super__Tuple_impl<0UL,_const_trust_token_method_st_*,_bool,_int,_bool>).
       super__Tuple_impl<1UL,_bool,_int,_bool>.super__Tuple_impl<2UL,_int,_bool>.
       super__Head_base<2UL,_int,_false>._M_head_impl;
  pPVar6 = testing::WithParamInterface<std::tuple<const_trust_token_method_st_*,_bool,_int,_bool>_>
           ::GetParam();
  iVar5 = TRUST_TOKEN_ISSUER_issue
                    (ctx,&issue_resp,&resp_len,&tokens_issued,request,msg_len,public_metadata,
                     (pPVar6->super__Tuple_impl<0UL,_const_trust_token_method_st_*,_bool,_int,_bool>
                     ).super__Tuple_impl<1UL,_bool,_int,_bool>.super__Tuple_impl<2UL,_int,_bool>.
                     super__Tuple_impl<3UL,_bool>.super__Head_base<3UL,_bool,_false>._M_head_impl,1)
  ;
  dleq.child._0_1_ = iVar5 != 0;
  dleq.is_child = '\0';
  dleq._9_7_ = 0;
  if (iVar5 == 0) {
    testing::Message::Message((Message *)&gtest_ar__3);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&bad_response,(internal *)&dleq,
               (AssertionResult *)
               "TRUST_TOKEN_ISSUER_issue( issuer.get(), &issue_resp, &resp_len, &tokens_issued, issue_msg, msg_len, public_metadata(), private_metadata(), 1)"
               ,"false","true",(char *)msg_len);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&real_response,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
               ,0x46d,(char *)bad_response.ctx_.child);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&real_response,(Message *)&gtest_ar__3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&real_response);
    if (bad_response.ctx_.child != (CBB *)&bad_response.ctx_.u) {
      operator_delete(bad_response.ctx_.child,(ulong)(bad_response.ctx_.u.base.buf + 1));
    }
    if ((long *)CONCAT71(gtest_ar__3._1_7_,gtest_ar__3.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar__3._1_7_,gtest_ar__3.success_) + 8))();
    }
    if (dleq._8_8_ != 0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&dleq.is_child,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)dleq._8_8_);
    }
    goto LAB_003a26ab;
  }
  free_msg._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)
       (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)issue_resp;
  real_response.data = issue_resp;
  real_response.len = resp_len;
  CBB_zero(&bad_response.ctx_);
  iVar5 = CBB_init(&bad_response.ctx_,0);
  gtest_ar__3.success_ = iVar5 != 0;
  gtest_ar__3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (iVar5 == 0) {
    pAVar3 = &gtest_ar__3;
    testing::Message::Message((Message *)&tmp);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&dleq,(internal *)&gtest_ar__3,
               (AssertionResult *)"CBB_init(bad_response.get(), 0)","false","true",(char *)msg_len);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__11,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
               ,0x475,(char *)CONCAT71(dleq.child._1_7_,dleq.child._0_1_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__11,(Message *)&tmp);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__11);
    if ((anon_union_32_2_4f6aaa2e_for_u *)CONCAT71(dleq.child._1_7_,dleq.child._0_1_) != &dleq.u) {
      operator_delete((undefined1 *)CONCAT71(dleq.child._1_7_,dleq.child._0_1_),
                      (ulong)(dleq.u.base.buf + 1));
    }
    __ptr_00._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         gtest_ar__3.message_._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
    if (tmp.data != (uint8_t *)0x0) {
      (**(code **)(*(long *)tmp.data + 8))();
      __ptr_00._M_head_impl =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar__3.message_
      ;
    }
joined_r0x003a2279:
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )__ptr_00._M_head_impl !=
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
LAB_003a268c:
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)((long)pAVar3 + 8),__ptr_00._M_head_impl);
    }
  }
  else {
    iVar5 = CBS_get_u16(&real_response,&count);
    gtest_ar__3.success_ = iVar5 != 0;
    gtest_ar__3.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    if (iVar5 == 0) {
      pAVar3 = &gtest_ar__3;
      testing::Message::Message((Message *)&tmp);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&dleq,(internal *)&gtest_ar__3,
                 (AssertionResult *)"CBS_get_u16(&real_response, &count)","false","true",
                 (char *)msg_len);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__11,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
                 ,0x476,(char *)CONCAT71(dleq.child._1_7_,dleq.child._0_1_));
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__11,(Message *)&tmp);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__11);
      if ((anon_union_32_2_4f6aaa2e_for_u *)CONCAT71(dleq.child._1_7_,dleq.child._0_1_) != &dleq.u)
      {
        operator_delete((undefined1 *)CONCAT71(dleq.child._1_7_,dleq.child._0_1_),
                        (ulong)(dleq.u.base.buf + 1));
      }
      __ptr_00._M_head_impl =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           gtest_ar__3.message_._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
      if (tmp.data != (uint8_t *)0x0) {
        (**(code **)(*(long *)tmp.data + 8))();
        __ptr_00._M_head_impl =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             gtest_ar__3.message_;
      }
      goto joined_r0x003a2279;
    }
    iVar5 = CBB_add_u16(&bad_response.ctx_,count);
    gtest_ar__3.success_ = iVar5 != 0;
    gtest_ar__3.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    if (!gtest_ar__3.success_) {
      testing::Message::Message((Message *)&tmp);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&dleq,(internal *)&gtest_ar__3,
                 (AssertionResult *)"CBB_add_u16(bad_response.get(), count)","false","true",
                 (char *)msg_len);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__11,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
                 ,0x477,(char *)CONCAT71(dleq.child._1_7_,dleq.child._0_1_));
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__11,(Message *)&tmp);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__11);
      if ((anon_union_32_2_4f6aaa2e_for_u *)CONCAT71(dleq.child._1_7_,dleq.child._0_1_) != &dleq.u)
      {
        operator_delete((undefined1 *)CONCAT71(dleq.child._1_7_,dleq.child._0_1_),
                        (ulong)(dleq.u.base.buf + 1));
      }
      if (tmp.data != (uint8_t *)0x0) {
        (**(code **)(*(long *)tmp.data + 8))();
      }
joined_r0x003a1d50:
      pAVar3 = &gtest_ar__3;
      __ptr_00._M_head_impl =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           gtest_ar__3.message_._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
      goto joined_r0x003a2279;
    }
    iVar5 = CBS_get_u32(&real_response,&parsed_public_metadata);
    gtest_ar__3.success_ = iVar5 != 0;
    gtest_ar__3.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    if (!gtest_ar__3.success_) {
      testing::Message::Message((Message *)&tmp);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&dleq,(internal *)&gtest_ar__3,
                 (AssertionResult *)"CBS_get_u32(&real_response, &parsed_public_metadata)","false",
                 "true",(char *)msg_len);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__11,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
                 ,0x478,(char *)CONCAT71(dleq.child._1_7_,dleq.child._0_1_));
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__11,(Message *)&tmp);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__11);
      if ((anon_union_32_2_4f6aaa2e_for_u *)CONCAT71(dleq.child._1_7_,dleq.child._0_1_) != &dleq.u)
      {
        operator_delete((undefined1 *)CONCAT71(dleq.child._1_7_,dleq.child._0_1_),
                        (ulong)(dleq.u.base.buf + 1));
      }
      if (tmp.data != (uint8_t *)0x0) {
        (**(code **)(*(long *)tmp.data + 8))();
      }
      goto joined_r0x003a1d50;
    }
    iVar5 = CBB_add_u32(&bad_response.ctx_,parsed_public_metadata);
    gtest_ar__3.success_ = iVar5 != 0;
    gtest_ar__3.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    if (!gtest_ar__3.success_) {
      testing::Message::Message((Message *)&tmp);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&dleq,(internal *)&gtest_ar__3,
                 (AssertionResult *)"CBB_add_u32(bad_response.get(), parsed_public_metadata)",
                 "false","true",(char *)msg_len);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__11,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
                 ,0x479,(char *)CONCAT71(dleq.child._1_7_,dleq.child._0_1_));
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__11,(Message *)&tmp);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__11);
      if ((anon_union_32_2_4f6aaa2e_for_u *)CONCAT71(dleq.child._1_7_,dleq.child._0_1_) != &dleq.u)
      {
        operator_delete((undefined1 *)CONCAT71(dleq.child._1_7_,dleq.child._0_1_),
                        (ulong)(dleq.u.base.buf + 1));
      }
      if (tmp.data != (uint8_t *)0x0) {
        (**(code **)(*(long *)tmp.data + 8))();
      }
joined_r0x003a212a:
      pAVar3 = &gtest_ar__3;
      __ptr_00._M_head_impl =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           gtest_ar__3.message_._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
      goto joined_r0x003a2279;
    }
    pTVar1 = (this->super_TrustTokenMetadataTest).super_TrustTokenProtocolTestBase.method_;
    pTVar7 = TRUST_TOKEN_experiment_v1();
    pTVar2 = (this->super_TrustTokenMetadataTest).super_TrustTokenProtocolTestBase.method_;
    pTVar8 = TRUST_TOKEN_experiment_v2_voprf();
    if ((pTVar2 == pTVar8) ||
       (pTVar2 = (this->super_TrustTokenMetadataTest).super_TrustTokenProtocolTestBase.method_,
       pTVar8 = TRUST_TOKEN_pst_v1_voprf(), pTVar2 == pTVar8)) {
      len = 0x61;
      pcVar9 = (char *)msg_len;
    }
    else {
      len = (ulong)(pTVar1 == pTVar7) * 4 + 0x102;
      pcVar9 = (char *)msg_len;
    }
    if (count != 0) {
      pAVar3 = &gtest_ar__3;
      uVar10 = 0;
      do {
        iVar5 = CBB_add_bytes(&bad_response.ctx_,real_response.data,len);
        gtest_ar__3.success_ = iVar5 != 0;
        gtest_ar__3.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        if (iVar5 == 0) {
          testing::Message::Message((Message *)&tmp);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&dleq,(internal *)&gtest_ar__3,
                     (AssertionResult *)
                     "CBB_add_bytes(bad_response.get(), CBS_data(&real_response), token_length)",
                     "false","true",pcVar9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar__11,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
                     ,0x486,(char *)CONCAT71(dleq.child._1_7_,dleq.child._0_1_));
          testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__11,(Message *)&tmp);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__11);
          if ((anon_union_32_2_4f6aaa2e_for_u *)CONCAT71(dleq.child._1_7_,dleq.child._0_1_) !=
              &dleq.u) {
            operator_delete((undefined1 *)CONCAT71(dleq.child._1_7_,dleq.child._0_1_),
                            (ulong)(dleq.u.base.buf + 1));
          }
          __ptr_00._M_head_impl =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               gtest_ar__3.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
          if (tmp.data != (uint8_t *)0x0) {
            (**(code **)(*(long *)tmp.data + 8))();
            __ptr_00._M_head_impl =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 gtest_ar__3.message_;
          }
          goto joined_r0x003a2279;
        }
        iVar5 = CBS_skip(&real_response,len);
        gtest_ar__3.success_ = iVar5 != 0;
        gtest_ar__3.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        if (iVar5 == 0) {
          testing::Message::Message((Message *)&tmp);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&dleq,(internal *)&gtest_ar__3,
                     (AssertionResult *)"CBS_skip(&real_response, token_length)","false","true",
                     pcVar9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar__11,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
                     ,0x487,(char *)CONCAT71(dleq.child._1_7_,dleq.child._0_1_));
          testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__11,(Message *)&tmp);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__11);
          if ((anon_union_32_2_4f6aaa2e_for_u *)CONCAT71(dleq.child._1_7_,dleq.child._0_1_) !=
              &dleq.u) {
            operator_delete((undefined1 *)CONCAT71(dleq.child._1_7_,dleq.child._0_1_),
                            (ulong)(dleq.u.base.buf + 1));
          }
          if (tmp.data != (uint8_t *)0x0) {
            (**(code **)(*(long *)tmp.data + 8))();
          }
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar__3.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) goto LAB_003a2691;
          pAVar3 = &gtest_ar__3;
          __ptr_00._M_head_impl =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               gtest_ar__3.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
          goto LAB_003a268c;
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 < count);
    }
    iVar5 = CBS_get_u16_length_prefixed(&real_response,&tmp);
    gtest_ar__3.success_ = iVar5 != 0;
    gtest_ar__3.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    if (!gtest_ar__3.success_) {
      testing::Message::Message((Message *)&gtest_ar__11);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&dleq,(internal *)&gtest_ar__3,
                 (AssertionResult *)"CBS_get_u16_length_prefixed(&real_response, &tmp)","false",
                 "true",pcVar9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&bad_buf,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
                 ,0x48b,(char *)CONCAT71(dleq.child._1_7_,dleq.child._0_1_));
      testing::internal::AssertHelper::operator=((AssertHelper *)&bad_buf,(Message *)&gtest_ar__11);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&bad_buf);
      if ((anon_union_32_2_4f6aaa2e_for_u *)CONCAT71(dleq.child._1_7_,dleq.child._0_1_) != &dleq.u)
      {
        operator_delete((undefined1 *)CONCAT71(dleq.child._1_7_,dleq.child._0_1_),
                        (ulong)(dleq.u.base.buf + 1));
      }
      if ((long *)CONCAT71(gtest_ar__11._1_7_,gtest_ar__11.success_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(gtest_ar__11._1_7_,gtest_ar__11.success_) + 8))();
      }
      goto joined_r0x003a212a;
    }
    iVar5 = CBB_add_u16_length_prefixed(&bad_response.ctx_,&dleq);
    gtest_ar__11.success_ = iVar5 != 0;
    gtest_ar__11.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    if (iVar5 == 0) {
      testing::Message::Message((Message *)&bad_buf);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__3,(internal *)&gtest_ar__11,
                 (AssertionResult *)"CBB_add_u16_length_prefixed(bad_response.get(), &dleq)","false"
                 ,"true",pcVar9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&bad_len,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
                 ,0x48d,(char *)CONCAT71(gtest_ar__3._1_7_,gtest_ar__3.success_));
      testing::internal::AssertHelper::operator=((AssertHelper *)&bad_len,(Message *)&bad_buf);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&bad_len);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(gtest_ar__3._1_7_,gtest_ar__3.success_) != &local_140) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(gtest_ar__3._1_7_,gtest_ar__3.success_),
                        local_140._M_allocated_capacity + 1);
      }
      if (bad_buf != (uint8_t *)0x0) {
        (**(code **)(*(long *)bad_buf + 8))();
      }
joined_r0x003a23cd:
      pAVar3 = &gtest_ar__11;
      __ptr_00._M_head_impl =
           (_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            )gtest_ar__11.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
      goto joined_r0x003a2279;
    }
    iVar5 = CBB_add_bytes(&dleq,tmp.data,tmp.len);
    gtest_ar__11.success_ = iVar5 != 0;
    gtest_ar__11.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    if (!gtest_ar__11.success_) {
      testing::Message::Message((Message *)&bad_buf);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__3,(internal *)&gtest_ar__11,
                 (AssertionResult *)"CBB_add_bytes(&dleq, CBS_data(&tmp), CBS_len(&tmp))","false",
                 "true",pcVar9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&bad_len,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
                 ,0x48e,(char *)CONCAT71(gtest_ar__3._1_7_,gtest_ar__3.success_));
      testing::internal::AssertHelper::operator=((AssertHelper *)&bad_len,(Message *)&bad_buf);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&bad_len);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(gtest_ar__3._1_7_,gtest_ar__3.success_) != &local_140) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(gtest_ar__3._1_7_,gtest_ar__3.success_),
                        local_140._M_allocated_capacity + 1);
      }
      if (bad_buf != (uint8_t *)0x0) {
        (**(code **)(*(long *)bad_buf + 8))();
      }
      goto joined_r0x003a23cd;
    }
    iVar5 = CBB_add_u16(&dleq,0x2a);
    gtest_ar__11.success_ = iVar5 != 0;
    gtest_ar__11.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    if (!gtest_ar__11.success_) {
      testing::Message::Message((Message *)&bad_buf);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__3,(internal *)&gtest_ar__11,
                 (AssertionResult *)"CBB_add_u16(&dleq, 42)","false","true",pcVar9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&bad_len,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
                 ,0x48f,(char *)CONCAT71(gtest_ar__3._1_7_,gtest_ar__3.success_));
      testing::internal::AssertHelper::operator=((AssertHelper *)&bad_len,(Message *)&bad_buf);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&bad_len);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(gtest_ar__3._1_7_,gtest_ar__3.success_) != &local_140) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(gtest_ar__3._1_7_,gtest_ar__3.success_),
                        local_140._M_allocated_capacity + 1);
      }
      if (bad_buf != (uint8_t *)0x0) {
        (**(code **)(*(long *)bad_buf + 8))();
      }
joined_r0x003a2521:
      pAVar3 = &gtest_ar__11;
      __ptr_00._M_head_impl =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           gtest_ar__11.message_._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
      goto joined_r0x003a2279;
    }
    iVar5 = CBB_flush(&bad_response.ctx_);
    gtest_ar__11.success_ = iVar5 != 0;
    gtest_ar__11.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    if (!gtest_ar__11.success_) {
      testing::Message::Message((Message *)&bad_buf);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__3,(internal *)&gtest_ar__11,
                 (AssertionResult *)"CBB_flush(bad_response.get())","false","true",pcVar9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&bad_len,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
                 ,0x490,(char *)CONCAT71(gtest_ar__3._1_7_,gtest_ar__3.success_));
      testing::internal::AssertHelper::operator=((AssertHelper *)&bad_len,(Message *)&bad_buf);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&bad_len);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(gtest_ar__3._1_7_,gtest_ar__3.success_) != &local_140) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(gtest_ar__3._1_7_,gtest_ar__3.success_),
                        local_140._M_allocated_capacity + 1);
      }
      if (bad_buf != (uint8_t *)0x0) {
        (**(code **)(*(long *)bad_buf + 8))();
      }
      goto joined_r0x003a2521;
    }
    iVar5 = CBB_finish(&bad_response.ctx_,&bad_buf,&bad_len);
    gtest_ar__11.success_ = iVar5 != 0;
    gtest_ar__11.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    if (!gtest_ar__11.success_) {
      pAVar3 = &gtest_ar__11;
      testing::Message::Message((Message *)&free_bad);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__3,(internal *)&gtest_ar__11,
                 (AssertionResult *)"CBB_finish(bad_response.get(), &bad_buf, &bad_len)","false",
                 "true",pcVar9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&key_index,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
                 ,0x494,(char *)CONCAT71(gtest_ar__3._1_7_,gtest_ar__3.success_));
      testing::internal::AssertHelper::operator=((AssertHelper *)&key_index,(Message *)&free_bad);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&key_index);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(gtest_ar__3._1_7_,gtest_ar__3.success_) != &local_140) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(gtest_ar__3._1_7_,gtest_ar__3.success_),
                        local_140._M_allocated_capacity + 1);
      }
      __ptr_00._M_head_impl =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           gtest_ar__11.message_._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
      if ((__uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>)
          free_bad._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>)0x0) {
        (**(code **)(*(long *)free_bad._M_t.
                              super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 8))();
        __ptr_00._M_head_impl =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             gtest_ar__11.message_;
      }
      goto joined_r0x003a2279;
    }
    free_bad._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)bad_buf;
    tokens._M_t.super___uniq_ptr_impl<stack_st_TRUST_TOKEN,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_stack_st_TRUST_TOKEN_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_stack_st_TRUST_TOKEN_*,_false>._M_head_impl =
         (__uniq_ptr_data<stack_st_TRUST_TOKEN,_bssl::internal::Deleter,_true,_true>)
         TRUST_TOKEN_CLIENT_finish_issuance
                   ((this->super_TrustTokenMetadataTest).super_TrustTokenProtocolTestBase.client.
                    _M_t.super___uniq_ptr_impl<trust_token_client_st,_bssl::internal::Deleter>._M_t.
                    super__Tuple_impl<0UL,_trust_token_client_st_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_trust_token_client_st_*,_false>._M_head_impl,&key_index,
                    bad_buf,bad_len);
    gtest_ar__11.success_ =
         (tuple<stack_st_TRUST_TOKEN_*,_bssl::internal::Deleter>)
         tokens._M_t.super___uniq_ptr_impl<stack_st_TRUST_TOKEN,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_stack_st_TRUST_TOKEN_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_stack_st_TRUST_TOKEN_*,_false>._M_head_impl ==
         (_Head_base<0UL,_stack_st_TRUST_TOKEN_*,_false>)0x0;
    gtest_ar__11.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    if (!gtest_ar__11.success_) {
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__3,(internal *)&gtest_ar__11,(AssertionResult *)"tokens","true"
                 ,"false",pcVar9);
      testing::internal::AssertHelper::AssertHelper
                (&local_80,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
                 ,0x49b,(char *)CONCAT71(gtest_ar__3._1_7_,gtest_ar__3.success_));
      testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(gtest_ar__3._1_7_,gtest_ar__3.success_) != &local_140) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(gtest_ar__3._1_7_,gtest_ar__3.success_),
                        local_140._M_allocated_capacity + 1);
      }
      if (local_90._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_90._M_head_impl + 8))();
      }
    }
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar__11.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&gtest_ar__11.message_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   gtest_ar__11.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl);
    }
    std::unique_ptr<stack_st_TRUST_TOKEN,_bssl::internal::Deleter>::~unique_ptr(&tokens);
    std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr(&free_bad);
  }
LAB_003a2691:
  CBB_cleanup(&bad_response.ctx_);
  std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr(&free_msg);
LAB_003a26ab:
  std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr(&free_issue_msg);
  return;
}

Assistant:

TEST_P(TrustTokenMetadataTest, ExcessDataProof) {
  if (!method()->has_private_metadata && private_metadata()) {
    return;
  }

  ASSERT_NO_FATAL_FAILURE(SetupContexts());

  uint8_t *issue_msg = NULL, *issue_resp = NULL;
  size_t msg_len, resp_len;
  if (use_message()) {
    ASSERT_TRUE(TRUST_TOKEN_CLIENT_begin_issuance_over_message(
        client.get(), &issue_msg, &msg_len, 10, kMessage, sizeof(kMessage)));
  } else {
    ASSERT_TRUE(TRUST_TOKEN_CLIENT_begin_issuance(client.get(), &issue_msg,
                                                  &msg_len, 10));
  }
  bssl::UniquePtr<uint8_t> free_issue_msg(issue_msg);
  size_t tokens_issued;
  ASSERT_TRUE(TRUST_TOKEN_ISSUER_issue(
      issuer.get(), &issue_resp, &resp_len, &tokens_issued, issue_msg, msg_len,
      public_metadata(), private_metadata(), /*max_issuance=*/1));
  bssl::UniquePtr<uint8_t> free_msg(issue_resp);

  CBS real_response;
  CBS_init(&real_response, issue_resp, resp_len);
  uint16_t count;
  uint32_t parsed_public_metadata;
  bssl::ScopedCBB bad_response;
  ASSERT_TRUE(CBB_init(bad_response.get(), 0));
  ASSERT_TRUE(CBS_get_u16(&real_response, &count));
  ASSERT_TRUE(CBB_add_u16(bad_response.get(), count));
  ASSERT_TRUE(CBS_get_u32(&real_response, &parsed_public_metadata));
  ASSERT_TRUE(CBB_add_u32(bad_response.get(), parsed_public_metadata));

  const size_t kP384PointLen = 1 + 2 * (384 / 8);
  size_t token_length = TRUST_TOKEN_NONCE_SIZE + 2 * kP384PointLen;
  if (method() == TRUST_TOKEN_experiment_v1()) {
    token_length += 4;
  }
  if (method() == TRUST_TOKEN_experiment_v2_voprf() ||
      method() == TRUST_TOKEN_pst_v1_voprf()) {
    token_length = kP384PointLen;
  }
  for (size_t i = 0; i < count; i++) {
    ASSERT_TRUE(CBB_add_bytes(bad_response.get(), CBS_data(&real_response),
                              token_length));
    ASSERT_TRUE(CBS_skip(&real_response, token_length));
  }

  CBS tmp;
  ASSERT_TRUE(CBS_get_u16_length_prefixed(&real_response, &tmp));
  CBB dleq;
  ASSERT_TRUE(CBB_add_u16_length_prefixed(bad_response.get(), &dleq));
  ASSERT_TRUE(CBB_add_bytes(&dleq, CBS_data(&tmp), CBS_len(&tmp)));
  ASSERT_TRUE(CBB_add_u16(&dleq, 42));
  ASSERT_TRUE(CBB_flush(bad_response.get()));

  uint8_t *bad_buf;
  size_t bad_len;
  ASSERT_TRUE(CBB_finish(bad_response.get(), &bad_buf, &bad_len));
  bssl::UniquePtr<uint8_t> free_bad(bad_buf);

  size_t key_index;
  bssl::UniquePtr<STACK_OF(TRUST_TOKEN)> tokens(
      TRUST_TOKEN_CLIENT_finish_issuance(client.get(), &key_index, bad_buf,
                                         bad_len));
  ASSERT_FALSE(tokens);
}